

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::TestGroupExtension::ByteSizeLong(TestGroupExtension *this)

{
  size_t sVar1;
  
  sVar1 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar1 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar1,&(this->field_0)._impl_._cached_size_);
  return sVar1;
}

Assistant:

::size_t TestGroupExtension::ByteSizeLong() const {
  const TestGroupExtension& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestGroupExtension)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}